

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InputScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                        void *p_step,void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiWindow_conflict *pIVar1;
  size_t sVar2;
  ImGuiContext_conflict1 *pIVar3;
  bool bVar4;
  char *text_end;
  bool bVar5;
  int int_id;
  float w_full;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    w_full = CalcItemWidth();
    PushMultiItemsWidths(components,w_full);
    int_id = 0;
    if (components < 1) {
      bVar5 = false;
    }
    else {
      sVar2 = GDataTypeInfo[data_type].Size;
      bVar5 = false;
      do {
        PushID(int_id);
        if (int_id != 0) {
          SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
        }
        bVar4 = InputScalar("",data_type,p_data,p_step,p_step_fast,format,flags);
        bVar5 = (bool)(bVar5 | bVar4);
        PopID();
        PopItemWidth();
        p_data = (void *)((long)p_data + sVar2);
        int_id = int_id + 1;
      } while (components != int_id);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    if (text_end != label) {
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      TextEx(label,text_end,0);
    }
    EndGroup();
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::InputScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= InputScalar("", data_type, p_data, p_step, p_step_fast, format, flags);
        PopID();
        PopItemWidth();
        p_data = (void*)((char*)p_data + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0.0f, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}